

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O1

Dsd_Node_t * Dsd_TreeNodeCreate(int Type,int nDecs,int BlockNum)

{
  Dsd_Node_t *pDVar1;
  Dsd_Node_t **ppDVar2;
  short sVar3;
  
  pDVar1 = (Dsd_Node_t *)malloc(0x28);
  *(undefined8 *)pDVar1 = 0;
  pDVar1->G = (DdNode *)0x0;
  pDVar1->S = (DdNode *)0x0;
  pDVar1->pDecs = (Dsd_Node_t **)0x0;
  pDVar1->Mark = 0;
  pDVar1->nDecs = 0;
  pDVar1->nVisits = 0;
  pDVar1->Type = Type;
  sVar3 = (short)nDecs;
  pDVar1->nDecs = sVar3;
  if (sVar3 != 0) {
    ppDVar2 = (Dsd_Node_t **)malloc((long)sVar3 << 3);
    pDVar1->pDecs = ppDVar2;
    *ppDVar2 = (Dsd_Node_t *)0x0;
  }
  return pDVar1;
}

Assistant:

Dsd_Node_t * Dsd_TreeNodeCreate( int Type, int nDecs, int BlockNum )
{
    // allocate memory for this node 
    Dsd_Node_t * p = (Dsd_Node_t *) ABC_ALLOC( char, sizeof(Dsd_Node_t) );
    memset( p, 0, sizeof(Dsd_Node_t) );
    p->Type       = (Dsd_Type_t)Type;       // the type of this block
    p->nDecs      = nDecs;                  // the number of decompositions
    if ( p->nDecs )
    {
        p->pDecs      = (Dsd_Node_t **) ABC_ALLOC( char, p->nDecs * sizeof(Dsd_Node_t *) );
        p->pDecs[0]   = NULL;
    }
    return p;
}